

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

void __thiscall cmCTestHG::LoadModifications(cmCTestHG *this)

{
  char *hg_status [3];
  OutputLogger err;
  StatusParser out;
  pointer local_178;
  char *local_170;
  undefined8 local_168;
  LineParser local_160;
  StatusParser local_120;
  
  local_178 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_170 = "status";
  local_168 = 0;
  StatusParser::StatusParser(&local_120,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_160,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "status-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_178,(OutputParser *)&local_120,
                      &local_160.super_OutputParser,(char *)0x0);
  cmProcessTools::LineParser::~LineParser(&local_160);
  StatusParser::~StatusParser(&local_120);
  return;
}

Assistant:

void cmCTestHG::LoadModifications()
{
  // Use 'hg status' to get modified files.
  const char* hg = this->CommandLineTool.c_str();
  const char* hg_status[] = {hg, "status", 0};
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(hg_status, &out, &err);
}